

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O1

void Diligent::anon_unknown_231::InitPipelineShaderStages
               (VulkanLogicalDevice *LogicalDevice,TShaderStages *ShaderStages,
               vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
               *ShaderModules,
               vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               *Stages)

{
  pointer *ppVVar1;
  SHADER_TYPE ShaderType;
  ShaderVkImpl *this;
  iterator __position;
  VkShaderStageFlagBits VVar2;
  pointer ppSVar3;
  char (*Args_1) [32];
  ulong uVar4;
  pointer pSVar5;
  long lVar6;
  VkPipelineShaderStageCreateInfo StageCI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> SPIRV;
  VkShaderModuleCreateInfo ShaderModuleCI;
  undefined1 local_e8 [20];
  VkShaderStageFlagBits VStack_d4;
  undefined8 uStack_d0;
  char *local_c8;
  VkSpecializationInfo *pVStack_c0;
  pointer local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  TShaderStages *local_90;
  ulong local_88;
  VulkanLogicalDevice *local_80;
  VkShaderModuleCreateInfo local_78;
  ShaderModuleWrapper local_48;
  
  pSVar5 = (ShaderStages->
           super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_90 = ShaderStages;
  local_80 = LogicalDevice;
  if ((ShaderStages->
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      )._M_impl.super__Vector_impl_data._M_finish != pSVar5) {
    uVar4 = 0;
    do {
      ShaderType = pSVar5[uVar4].Type;
      Args_1 = (char (*) [32])
               (((long)pSVar5[uVar4].SPIRVs.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)pSVar5[uVar4].SPIRVs.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
      if ((char (*) [32])
          ((long)pSVar5[uVar4].Shaders.
                 super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)pSVar5[uVar4].Shaders.
                 super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) != Args_1) {
        FormatString<char[26],char[32]>
                  ((string *)local_e8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Shaders.size() == SPIRVs.size()",Args_1);
        DebugAssertionFailed
                  ((Char *)local_e8._0_8_,"InitPipelineShaderStages",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x45);
        if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
          operator_delete((void *)local_e8._0_8_,stack0xffffffffffffff28 + 1);
        }
      }
      local_b0 = pSVar5 + uVar4;
      uStack_d0 = (VkShaderModule)0x0;
      local_c8 = (char *)0x0;
      pVStack_c0 = (VkSpecializationInfo *)0x0;
      local_e8._0_8_ = (Char *)0x12;
      local_e8._8_8_ = (void *)0x0;
      stack0xffffffffffffff28 = 0;
      local_88 = uVar4;
      VVar2 = ShaderTypeToVkShaderStageFlagBit(ShaderType);
      VStack_d4 = VVar2;
      local_78.codeSize = 0;
      local_78.pCode = (pointer)0x0;
      local_78.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
      local_78._4_4_ = 0;
      local_78.pNext = (void *)0x0;
      local_78.flags = 0;
      local_78._20_4_ = 0;
      ppSVar3 = (local_b0->Shaders).
                super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((local_b0->Shaders).
          super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppSVar3) {
        lVar6 = 0;
        uVar4 = 0;
        do {
          this = ppSVar3[uVar4];
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_a8,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&(((local_b0->SPIRVs).
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data + lVar6));
          local_78.codeSize =
               (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          local_78.pCode =
               local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
          VulkanUtilities::VulkanLogicalDevice::CreateShaderModule
                    (&local_48,local_80,&local_78,
                     (this->super_ShaderBase<Diligent::EngineVkImplTraits>).
                     super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                     .m_Desc.super_DeviceObjectAttribs.Name);
          std::
          vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T*,(VulkanUtilities::VulkanHandleTypeId)10>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T*,(VulkanUtilities::VulkanHandleTypeId)10>>>
          ::
          emplace_back<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T*,(VulkanUtilities::VulkanHandleTypeId)10>>
                    ((vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T*,(VulkanUtilities::VulkanHandleTypeId)10>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T*,(VulkanUtilities::VulkanHandleTypeId)10>>>
                      *)ShaderModules,&local_48);
          VulkanUtilities::
          VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>::
          ~VulkanObjectWrapper(&local_48);
          uStack_d0 = (ShaderModules->
                      super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish[-1].m_VkObject;
          local_c8 = ShaderVkImpl::GetEntryPoint(this);
          pVStack_c0 = (VkSpecializationInfo *)0x0;
          __position._M_current =
               (Stages->
               super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (Stages->
              super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<VkPipelineShaderStageCreateInfo,std::allocator<VkPipelineShaderStageCreateInfo>>
            ::_M_realloc_insert<VkPipelineShaderStageCreateInfo_const&>
                      ((vector<VkPipelineShaderStageCreateInfo,std::allocator<VkPipelineShaderStageCreateInfo>>
                        *)Stages,__position,(VkPipelineShaderStageCreateInfo *)local_e8);
          }
          else {
            (__position._M_current)->pName = local_c8;
            (__position._M_current)->pSpecializationInfo = (VkSpecializationInfo *)0x0;
            (__position._M_current)->flags = local_e8._16_4_;
            (__position._M_current)->stage = VStack_d4;
            (__position._M_current)->module = (VkShaderModule)uStack_d0;
            *(undefined8 *)__position._M_current = local_e8._0_8_;
            (__position._M_current)->pNext = (void *)local_e8._8_8_;
            ppVVar1 = &(Stages->
                       super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppVVar1 = *ppVVar1 + 1;
          }
          if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_a8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar4 = uVar4 + 1;
          ppSVar3 = (local_b0->Shaders).
                    super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar6 = lVar6 + 0x18;
        } while (uVar4 < (ulong)((long)(local_b0->Shaders).
                                       super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >>
                                3));
      }
      uVar4 = local_88 + 1;
      pSVar5 = (local_90->
               super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)(((long)(local_90->
                                    super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 3)
                            * 0x6db6db6db6db6db7));
  }
  lVar6 = (long)(Stages->
                super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(Stages->
                super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4;
  if (((long)(ShaderModules->
             super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(ShaderModules->
             super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
      lVar6 * 0x5555555555555555 != 0) {
    FormatString<char[26],char[38]>
              ((string *)local_e8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ShaderModules.size() == Stages.size()",
               (char (*) [38])(lVar6 * -0x5555555555555555));
    DebugAssertionFailed
              ((Char *)local_e8._0_8_,"InitPipelineShaderStages",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,100);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,stack0xffffffffffffff28 + 1);
    }
  }
  return;
}

Assistant:

void InitPipelineShaderStages(const VulkanUtilities::VulkanLogicalDevice&        LogicalDevice,
                              PipelineStateVkImpl::TShaderStages&                ShaderStages,
                              std::vector<VulkanUtilities::ShaderModuleWrapper>& ShaderModules,
                              std::vector<VkPipelineShaderStageCreateInfo>&      Stages)
{
    for (size_t s = 0; s < ShaderStages.size(); ++s)
    {
        const std::vector<const ShaderVkImpl*>& Shaders    = ShaderStages[s].Shaders;
        std::vector<std::vector<uint32_t>>&     SPIRVs     = ShaderStages[s].SPIRVs;
        const SHADER_TYPE                       ShaderType = ShaderStages[s].Type;

        VERIFY_EXPR(Shaders.size() == SPIRVs.size());

        VkPipelineShaderStageCreateInfo StageCI{};
        StageCI.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
        StageCI.pNext = nullptr;
        StageCI.flags = 0; //  reserved for future use
        StageCI.stage = ShaderTypeToVkShaderStageFlagBit(ShaderType);

        VkShaderModuleCreateInfo ShaderModuleCI{};
        ShaderModuleCI.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
        ShaderModuleCI.pNext = nullptr;
        ShaderModuleCI.flags = 0;

        for (size_t i = 0; i < Shaders.size(); ++i)
        {
            const ShaderVkImpl*         pShader = Shaders[i];
            const std::vector<uint32_t> SPIRV   = SPIRVs[i];

            ShaderModuleCI.codeSize = SPIRV.size() * sizeof(uint32_t);
            ShaderModuleCI.pCode    = SPIRV.data();

            ShaderModules.push_back(LogicalDevice.CreateShaderModule(ShaderModuleCI, pShader->GetDesc().Name));

            StageCI.module              = ShaderModules.back();
            StageCI.pName               = pShader->GetEntryPoint();
            StageCI.pSpecializationInfo = nullptr;

            Stages.push_back(StageCI);
        }
    }

    VERIFY_EXPR(ShaderModules.size() == Stages.size());
}